

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_af1b0::MicTestPlugIn::close(MicTestPlugIn *this,int __fd)

{
  Player *pPVar1;
  pointer ppPVar2;
  ulong uVar3;
  
  if (this->m_PlayerCountA != 0) {
    uVar3 = 0;
    do {
      pPVar1 = (this->TeamA).
               super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3];
      if (pPVar1 != (Player *)0x0) {
        (**(code **)(*(long *)&(pPVar1->super_SimpleVehicle).super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                    + 8))();
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->m_PlayerCountA);
  }
  ppPVar2 = (this->TeamA).
            super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->TeamA).
      super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
    (this->TeamA).
    super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar2;
  }
  if (this->m_PlayerCountB != 0) {
    uVar3 = 0;
    do {
      pPVar1 = (this->TeamB).
               super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3];
      if (pPVar1 != (Player *)0x0) {
        (**(code **)(*(long *)&(pPVar1->super_SimpleVehicle).super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                    + 8))();
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->m_PlayerCountB);
  }
  ppPVar2 = (this->TeamB).
            super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->TeamB).
      super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
    (this->TeamB).
    super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar2;
  }
  ppPVar2 = (this->m_AllPlayers).
            super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_AllPlayers).
      super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
    (this->m_AllPlayers).
    super__Vector_base<(anonymous_namespace)::Player_*,_std::allocator<(anonymous_namespace)::Player_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppPVar2;
  }
  return (int)ppPVar2;
}

Assistant:

void close (void)
        {
            for(unsigned int i=0; i < m_PlayerCountA ; i++)
                delete TeamA[i];
            TeamA.clear ();
            for(unsigned int i=0; i < m_PlayerCountB ; i++)
                delete TeamB[i];
            TeamB.clear ();
                    m_AllPlayers.clear();
        }